

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O0

void __thiscall QVariantAnimationPrivate::QVariantAnimationPrivate(QVariantAnimationPrivate *this)

{
  long lVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int *in_stack_ffffffffffffffa8;
  QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
  *this_00;
  QAbstractAnimationPrivate *in_stack_ffffffffffffffc0;
  anon_struct_80_2_29e96e20_for_currentInterval *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractAnimationPrivate::QAbstractAnimationPrivate(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__QVariantAnimationPrivate_00bea0d0;
  ::QVariant::QVariant((QVariant *)0x68d4aa);
  this_01 = (anon_struct_80_2_29e96e20_for_currentInterval *)(in_RDI + 0x18);
  ::QVariant::QVariant((QVariant *)0x68d4c0);
  {unnamed_type#1}::QVariantAnimationPrivate(this_01);
  this_00 = (QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
             *)(in_RDI + 0x26);
  QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
  ::QObjectCompatProperty
            ((QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
              *)0x68d4ee);
  QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
  ::QObjectCompatProperty(this_00,in_stack_ffffffffffffffa8);
  QList<std::pair<double,_QVariant>_>::QList((QList<std::pair<double,_QVariant>_> *)0x68d521);
  in_RDI[0x2b] = defaultInterpolator;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QVariantAnimationPrivate::QVariantAnimationPrivate() : duration(250), interpolator(&defaultInterpolator)
{ }